

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O1

Request<capnp::AnyPointer,_capnp::AnyPointer> * __thiscall
capnp::LocalClient::newCall
          (Request<capnp::AnyPointer,_capnp::AnyPointer> *__return_storage_ptr__,LocalClient *this,
          uint64_t interfaceId,uint16_t methodId,Maybe<capnp::MessageSize> *sizeHint,CallHints hints
          )

{
  uint *puVar1;
  ClientHook *pCVar2;
  ClientHook *pCVar3;
  CapTableBuilder *pCVar4;
  Own<capnp::LocalRequest,_std::nullptr_t> OVar5;
  Own<capnp::LocalRequest,_std::nullptr_t> hook;
  Builder root;
  uint16_t local_6c;
  CallHints local_6a;
  Disposer *local_68;
  RequestHook *pRStack_60;
  Builder local_58;
  uint64_t local_40;
  char local_38 [8];
  uint64_t local_30;
  undefined8 uStack_28;
  
  pCVar2 = (this->resolved).ptr.ptr;
  local_6c = methodId;
  local_6a = hints;
  local_40 = interfaceId;
  if (pCVar2 != (ClientHook *)0x0) {
    pCVar3 = (this->resolved).ptr.ptr;
    local_38[0] = (sizeHint->ptr).isSet;
    if ((bool)local_38[0] == true) {
      local_30 = (sizeHint->ptr).field_1.value.wordCount;
      uStack_28 = *(undefined8 *)((long)&(sizeHint->ptr).field_1 + 8);
    }
    (**pCVar3->_vptr_ClientHook)(__return_storage_ptr__,pCVar3,interfaceId,(ulong)methodId,local_38)
    ;
    if (pCVar2 != (ClientHook *)0x0) {
      return __return_storage_ptr__;
    }
  }
  puVar1 = &(this->super_Refcounted).refcount;
  *puVar1 = *puVar1 + 1;
  local_58.builder.segment = (SegmentBuilder *)&this->super_Refcounted;
  local_58.builder.capTable = (CapTableBuilder *)this;
  OVar5 = kj::
          heap<capnp::LocalRequest,unsigned_long&,unsigned_short&,kj::Maybe<capnp::MessageSize>&,capnp::Capability::Client::CallHints&,kj::Own<capnp::LocalClient,decltype(nullptr)>>
                    ((kj *)&local_68,&local_40,&local_6c,sizeHint,&local_6a,
                     (Own<capnp::LocalClient,_std::nullptr_t> *)&local_58);
  pCVar4 = local_58.builder.capTable;
  if ((LocalClient *)local_58.builder.capTable != (LocalClient *)0x0) {
    local_58.builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_58.builder.segment)->super_SegmentReader).arena)->_vptr_Arena)
              (local_58.builder.segment,
               (_func_int *)
               ((long)&((ClientHook *)&pCVar4->super_CapTableReader)->_vptr_ClientHook +
               (long)((ClientHook *)&pCVar4->super_CapTableReader)->_vptr_ClientHook[-2]),OVar5.ptr)
    ;
  }
  MessageBuilder::getRootInternal(&local_58,(MessageBuilder *)pRStack_60[1].brand);
  (__return_storage_ptr__->super_Builder).builder.pointer = local_58.builder.pointer;
  (__return_storage_ptr__->super_Builder).builder.segment = local_58.builder.segment;
  (__return_storage_ptr__->super_Builder).builder.capTable = local_58.builder.capTable;
  (__return_storage_ptr__->hook).disposer = local_68;
  (__return_storage_ptr__->hook).ptr = pRStack_60;
  return __return_storage_ptr__;
}

Assistant:

Request<AnyPointer, AnyPointer> newCall(
      uint64_t interfaceId, uint16_t methodId, kj::Maybe<MessageSize> sizeHint,
      CallHints hints) override {
    KJ_IF_SOME(r, resolved) {
      // We resolved to a shortened path. New calls MUST go directly to the replacement capability
      // so that their ordering is consistent with callers who call getResolved() to get direct
      // access to the new capability. In particular it's important that we don't place these calls
      // in our streaming queue.
      return r->newCall(interfaceId, methodId, sizeHint, hints);
    }

    auto hook = kj::heap<LocalRequest>(
        interfaceId, methodId, sizeHint, hints, kj::addRef(*this));
    auto root = hook->message->getRoot<AnyPointer>();
    return Request<AnyPointer, AnyPointer>(root, kj::mv(hook));
  }